

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O1

RealType __thiscall OpenMD::Snapshot::getYZarea(Snapshot *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint i;
  double *pdVar6;
  long lVar7;
  double tmp;
  double dVar8;
  Vector<double,_3U> v;
  double local_28 [4];
  
  if (this->hasYZarea == false) {
    local_28[0] = 0.0;
    local_28[1] = 0.0;
    local_28[2] = 0.0;
    pdVar6 = (this->frameData).hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
             data_[0] + 1;
    lVar7 = 0;
    do {
      local_28[lVar7] = *pdVar6;
      dVar5 = local_28[2];
      dVar4 = local_28[1];
      dVar2 = local_28[0];
      lVar7 = lVar7 + 1;
      pdVar6 = pdVar6 + 3;
    } while (lVar7 != 3);
    local_28[0] = 0.0;
    local_28[1] = 0.0;
    local_28[2] = 0.0;
    pdVar6 = (this->frameData).hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
             data_[0] + 2;
    lVar7 = 0;
    do {
      local_28[lVar7] = *pdVar6;
      dVar3 = local_28[0];
      lVar7 = lVar7 + 1;
      pdVar6 = pdVar6 + 3;
    } while (lVar7 != 3);
    dVar1 = dVar2 * local_28[1];
    dVar8 = local_28[0] * dVar5;
    local_28[0] = local_28[2] * dVar4 - dVar5 * local_28[1];
    local_28[1] = dVar8 - dVar2 * local_28[2];
    local_28[2] = dVar1 - dVar3 * dVar4;
    dVar2 = 0.0;
    lVar7 = 0;
    do {
      dVar2 = dVar2 + local_28[lVar7] * local_28[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    (this->frameData).yzArea = dVar2;
    this->hasYZarea = true;
  }
  return (this->frameData).yzArea;
}

Assistant:

RealType Snapshot::getYZarea() {
    if (!hasYZarea) {
      Vector3d y       = frameData.hmat.getColumn(1);
      Vector3d z       = frameData.hmat.getColumn(2);
      frameData.yzArea = cross(y, z).length();
      hasYZarea        = true;
    }
    return frameData.yzArea;
  }